

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

natwm_error map_search(map *map,void *key,uint32_t *index)

{
  map_entry *entry_00;
  _Bool _Var1;
  uint32_t uVar2;
  size_t sVar3;
  map_entry *entry;
  size_t i;
  uint32_t current_index;
  size_t key_size;
  uint32_t *index_local;
  void *key_local;
  map *map_local;
  
  if ((key == (void *)0x0) || (index == (uint32_t *)0x0)) {
    map_local._4_4_ = GENERIC_ERROR;
  }
  else {
    sVar3 = (*map->key_size_function)(key);
    uVar2 = (*map->hash_function)(key,sVar3);
    i._4_4_ = uVar2 % map->length;
    for (entry = (map_entry *)0x0; entry <= (map_entry *)(ulong)map->length;
        entry = (map_entry *)((long)&entry->hash + 1)) {
      if (map->length <= i._4_4_) {
        i._4_4_ = 0;
      }
      entry_00 = map->entries[i._4_4_];
      _Var1 = is_entry_present(entry_00);
      if ((_Var1) && (_Var1 = (*map->key_compare_function)(key,entry_00->key,sVar3), _Var1)) {
        *index = i._4_4_;
        return NO_ERROR;
      }
      i._4_4_ = i._4_4_ + 1;
    }
    map_local._4_4_ = NOT_FOUND_ERROR;
  }
  return map_local._4_4_;
}

Assistant:

static enum natwm_error map_search(const struct map *map, const void *key, uint32_t *index)
{
        if (key == NULL || index == NULL) {
                return GENERIC_ERROR;
        }

        // Initialize index with initial bucket index
        size_t key_size = map->key_size_function(key);
        uint32_t current_index = map->hash_function(key, key_size) % map->length;

        for (size_t i = 0; i <= map->length; ++i) {
                if ((current_index) >= map->length) {
                        current_index = 0;
                }

                struct map_entry *entry = map->entries[current_index];

                if (!is_entry_present(entry)
                    || !map->key_compare_function(key, entry->key, key_size)) {
                        current_index += 1;

                        continue;
                }

                *index = current_index;

                return NO_ERROR;
        }

        return NOT_FOUND_ERROR;
}